

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlParserCtxtPtr
xmlCreateEntityParserCtxtInternal
          (xmlSAXHandlerPtr sax,void *userData,xmlChar *URL,xmlChar *ID,xmlChar *base,
          xmlParserCtxtPtr pctx)

{
  int iVar1;
  xmlParserCtxtPtr ctxt;
  xmlChar *URL_00;
  xmlParserInputPtr pxVar2;
  char *pcVar3;
  
  ctxt = xmlNewSAXParserCtxt(sax,userData);
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    if (pctx != (xmlParserCtxtPtr)0x0) {
      ctxt->options = pctx->options;
      ctxt->_private = pctx->_private;
      ctxt->input_id = pctx->input_id + 1;
    }
    iVar1 = xmlStrcmp(URL,"-");
    pcVar3 = "./-";
    if (iVar1 != 0) {
      pcVar3 = (char *)URL;
    }
    URL_00 = xmlBuildURI((xmlChar *)pcVar3,base);
    if (URL_00 == (xmlChar *)0x0) {
      pxVar2 = xmlLoadExternalEntity(pcVar3,(char *)ID,ctxt);
      if (pxVar2 != (xmlParserInputPtr)0x0) {
        inputPush(ctxt,pxVar2);
        if (ctxt->directory != (char *)0x0) {
          return ctxt;
        }
        pcVar3 = xmlParserGetDirectory(pcVar3);
        if (pcVar3 == (char *)0x0 || ctxt->directory != (char *)0x0) {
          return ctxt;
        }
        ctxt->directory = pcVar3;
        return ctxt;
      }
    }
    else {
      pxVar2 = xmlLoadExternalEntity((char *)URL_00,(char *)ID,ctxt);
      if (pxVar2 != (xmlParserInputPtr)0x0) {
        inputPush(ctxt,pxVar2);
        if (((ctxt->directory == (char *)0x0) &&
            (pcVar3 = xmlParserGetDirectory((char *)URL_00), ctxt->directory == (char *)0x0)) &&
           (pcVar3 != (char *)0x0)) {
          ctxt->directory = pcVar3;
        }
        (*xmlFree)(URL_00);
        return ctxt;
      }
      (*xmlFree)(URL_00);
    }
    xmlFreeParserCtxt(ctxt);
  }
  return (xmlParserCtxtPtr)0x0;
}

Assistant:

static xmlParserCtxtPtr
xmlCreateEntityParserCtxtInternal(xmlSAXHandlerPtr sax, void *userData,
        const xmlChar *URL, const xmlChar *ID, const xmlChar *base,
        xmlParserCtxtPtr pctx) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr inputStream;
    char *directory = NULL;
    xmlChar *uri;

    ctxt = xmlNewSAXParserCtxt(sax, userData);
    if (ctxt == NULL) {
	return(NULL);
    }

    if (pctx != NULL) {
        ctxt->options = pctx->options;
        ctxt->_private = pctx->_private;
	/*
	 * this is a subparser of pctx, so the input_id should be
	 * incremented to distinguish from main entity
	 */
	ctxt->input_id = pctx->input_id + 1;
    }

    /* Don't read from stdin. */
    if (xmlStrcmp(URL, BAD_CAST "-") == 0)
        URL = BAD_CAST "./-";

    uri = xmlBuildURI(URL, base);

    if (uri == NULL) {
	inputStream = xmlLoadExternalEntity((char *)URL, (char *)ID, ctxt);
	if (inputStream == NULL) {
	    xmlFreeParserCtxt(ctxt);
	    return(NULL);
	}

	inputPush(ctxt, inputStream);

	if ((ctxt->directory == NULL) && (directory == NULL))
	    directory = xmlParserGetDirectory((char *)URL);
	if ((ctxt->directory == NULL) && (directory != NULL))
	    ctxt->directory = directory;
    } else {
	inputStream = xmlLoadExternalEntity((char *)uri, (char *)ID, ctxt);
	if (inputStream == NULL) {
	    xmlFree(uri);
	    xmlFreeParserCtxt(ctxt);
	    return(NULL);
	}

	inputPush(ctxt, inputStream);

	if ((ctxt->directory == NULL) && (directory == NULL))
	    directory = xmlParserGetDirectory((char *)uri);
	if ((ctxt->directory == NULL) && (directory != NULL))
	    ctxt->directory = directory;
	xmlFree(uri);
    }
    return(ctxt);
}